

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddy_allocator.h
# Opt level: O1

void __thiscall cppcms::impl::buddy_allocator::test_free(buddy_allocator *this)

{
  buddy_allocator *pbVar1;
  bool bVar2;
  buddy_allocator *pbVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  buddy_allocator *pbVar6;
  ulong uVar7;
  ostringstream oss;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  pbVar3 = this + 1;
  uVar7 = (ulong)this->max_bit_size_;
  pbVar6 = pbVar3;
  if (-1 < (long)uVar7) {
    do {
      pbVar1 = (buddy_allocator *)this->free_list_[uVar7];
      if (pbVar1 != (buddy_allocator *)0x0) {
        if (pbVar1 != pbVar6) {
          std::__cxx11::ostringstream::ostringstream(local_190);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_190,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
                     ,0x62);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x77);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," (char*)free_list_[i]==p",0x18)
          ;
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar5,local_1b0);
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (uVar7 != *(uint *)pbVar1->free_list_) {
          std::__cxx11::ostringstream::ostringstream(local_190);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_190,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
                     ,0x62);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x78);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4," free_list_[i]->bits == i",0x19);
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar5,local_1b0);
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pbVar6 = (buddy_allocator *)
                 ((long)pbVar6->free_list_ + (1L << ((byte)*(uint *)pbVar1->free_list_ & 0x3f)));
      }
      bVar2 = 0 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar2);
  }
  pbVar3 = (buddy_allocator *)((long)pbVar3->free_list_ + this->memory_size_);
  if (pbVar3 < pbVar6) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x7c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," p<= memory() + memory_size_",0x1c);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_1b0);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (0x1f < (long)pbVar3 - (long)pbVar6) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x7d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," memory() + memory_size_ - p < int(alignment * 2)",0x31);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_1b0);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

char *memory()
	{
		return reinterpret_cast<char *>(this) + sizeof(*this);
	}